

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.h
# Opt level: O0

int can_ipv6(void)

{
  int iVar1;
  long lVar2;
  int local_24;
  int local_20;
  int i;
  int count;
  int supported;
  uv_interface_address_t *addr;
  
  iVar1 = uv_interface_addresses(&count,&local_20);
  if (iVar1 == 0) {
    local_24 = 0;
    i = 0;
    while (i == 0 && local_24 < local_20) {
      lVar2 = (long)local_24;
      local_24 = local_24 + 1;
      i = (int)(*(short *)(_count + lVar2 * 0x50 + 0x14) == 10);
    }
    uv_free_interface_addresses(_count,local_20);
    addr._4_4_ = i;
  }
  else {
    addr._4_4_ = 0;
  }
  return addr._4_4_;
}

Assistant:

UNUSED static int can_ipv6(void) {
  uv_interface_address_t* addr;
  int supported;
  int count;
  int i;

  if (uv_interface_addresses(&addr, &count))
    return 0;  /* Assume no IPv6 support on failure. */

  supported = 0;
  for (i = 0; supported == 0 && i < count; i += 1)
    supported = (AF_INET6 == addr[i].address.address6.sin6_family);

  uv_free_interface_addresses(addr, count);
  return supported;
}